

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O0

long ogg_sync_pageseek(ogg_sync_state *oy,ogg_page *og)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  undefined1 local_68 [8];
  ogg_page log;
  int local_40;
  char chksum [4];
  int i;
  int headerbytes;
  long bytes;
  uchar *next;
  uchar *page;
  ogg_page *og_local;
  ogg_sync_state *oy_local;
  
  piVar2 = (int *)(oy->data + oy->returned);
  lVar3 = (long)(oy->fill - oy->returned);
  iVar1 = ogg_sync_check(oy);
  if (iVar1 != 0) {
    return 0;
  }
  if (oy->headerbytes == 0) {
    if (lVar3 < 0x1b) {
      return 0;
    }
    if (*piVar2 != 0x5367674f) goto LAB_002d6320;
    iVar1 = *(byte *)((long)piVar2 + 0x1a) + 0x1b;
    if (lVar3 < iVar1) {
      return 0;
    }
    for (local_40 = 0; local_40 < (int)(uint)*(byte *)((long)piVar2 + 0x1a); local_40 = local_40 + 1
        ) {
      oy->bodybytes = (uint)*(byte *)((long)piVar2 + (long)(local_40 + 0x1b)) + oy->bodybytes;
    }
    oy->headerbytes = iVar1;
  }
  if (lVar3 < oy->bodybytes + oy->headerbytes) {
    return 0;
  }
  log.body_len._4_4_ = *(int *)((long)piVar2 + 0x16);
  memset((void *)((long)piVar2 + 0x16),0,4);
  log.header = (uchar *)(long)oy->headerbytes;
  log.header_len = (long)piVar2 + (long)oy->headerbytes;
  log.body = (uchar *)(long)oy->bodybytes;
  local_68 = (undefined1  [8])piVar2;
  ogg_page_checksum_set((ogg_page *)local_68);
  if (log.body_len._4_4_ == *(int *)((long)piVar2 + 0x16)) {
    if (og != (ogg_page *)0x0) {
      og->header = (uchar *)piVar2;
      og->header_len = (long)oy->headerbytes;
      og->body = (uchar *)((long)piVar2 + (long)oy->headerbytes);
      og->body_len = (long)oy->bodybytes;
    }
    oy->unsynced = 0;
    iVar1 = oy->headerbytes + oy->bodybytes;
    oy->returned = oy->returned + iVar1;
    oy->headerbytes = 0;
    oy->bodybytes = 0;
    return (long)iVar1;
  }
  *(int *)((long)piVar2 + 0x16) = log.body_len._4_4_;
LAB_002d6320:
  oy->headerbytes = 0;
  oy->bodybytes = 0;
  bytes = (long)memchr((void *)((long)piVar2 + 1),0x4f,lVar3 - 1);
  if ((void *)bytes == (void *)0x0) {
    bytes = (long)(oy->data + oy->fill);
  }
  oy->returned = (int)bytes - (int)oy->data;
  return -(bytes - (long)piVar2);
}

Assistant:

long ogg_sync_pageseek(ogg_sync_state *oy,ogg_page *og){
  unsigned char *page=oy->data+oy->returned;
  unsigned char *next;
  long bytes=oy->fill-oy->returned;

  if(ogg_sync_check(oy))return 0;

  if(oy->headerbytes==0){
    int headerbytes,i;
    if(bytes<27)return(0); /* not enough for a header */

    /* verify capture pattern */
    if(memcmp(page,"OggS",4))goto sync_fail;

    headerbytes=page[26]+27;
    if(bytes<headerbytes)return(0); /* not enough for header + seg table */

    /* count up body length in the segment table */

    for(i=0;i<page[26];i++)
      oy->bodybytes+=page[27+i];
    oy->headerbytes=headerbytes;
  }

  if(oy->bodybytes+oy->headerbytes>bytes)return(0);

  /* The whole test page is buffered.  Verify the checksum */
  {
    /* Grab the checksum bytes, set the header field to zero */
    char chksum[4];
    ogg_page log;

    memcpy(chksum,page+22,4);
    memset(page+22,0,4);

    /* set up a temp page struct and recompute the checksum */
    log.header=page;
    log.header_len=oy->headerbytes;
    log.body=page+oy->headerbytes;
    log.body_len=oy->bodybytes;
    ogg_page_checksum_set(&log);

    /* Compare */
    if(memcmp(chksum,page+22,4)){
      /* D'oh.  Mismatch! Corrupt page (or miscapture and not a page
         at all) */
      /* replace the computed checksum with the one actually read in */
      memcpy(page+22,chksum,4);

#ifndef DISABLE_CRC
      /* Bad checksum. Lose sync */
      goto sync_fail;
#endif
    }
  }

  /* yes, have a whole page all ready to go */
  {
    if(og){
      og->header=page;
      og->header_len=oy->headerbytes;
      og->body=page+oy->headerbytes;
      og->body_len=oy->bodybytes;
    }

    oy->unsynced=0;
    oy->returned+=(bytes=oy->headerbytes+oy->bodybytes);
    oy->headerbytes=0;
    oy->bodybytes=0;
    return(bytes);
  }

 sync_fail:

  oy->headerbytes=0;
  oy->bodybytes=0;

  /* search for possible capture */
  next=memchr(page+1,'O',bytes-1);
  if(!next)
    next=oy->data+oy->fill;

  oy->returned=(int)(next-oy->data);
  return((long)-(next-page));
}